

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O3

void __thiscall helics::Input::loadSourceInformation(Input *this)

{
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  *this_00;
  char *pcVar1;
  char *pcVar2;
  element_type *peVar3;
  pointer ppVar4;
  string_view typeName;
  string_view typeName_00;
  string_view typeName_01;
  bool bVar5;
  DataType DVar6;
  precise_unit *__tmp;
  string *psVar7;
  string *psVar8;
  reference pbVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  uint64_t uVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  precise_unit *__tmp_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer ppVar14;
  size_type __new_size;
  data *this_02;
  long lVar15;
  string_view jsonString;
  string_view jsonString_00;
  string_view jsonString_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var16;
  precise_unit pVar17;
  json iValue;
  iterator __begin3;
  json jvalue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  data local_120;
  iterator in_stack_fffffffffffffef0;
  iterator iVar18;
  primitive_iterator_t in_stack_fffffffffffffef8;
  primitive_iterator_t pVar19;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_100;
  string *local_e0;
  data local_d8;
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  DataType local_a4;
  Input *local_a0;
  string local_98;
  void *local_78;
  string local_70;
  string local_50;
  
  if (this->targetType == HELICS_UNKNOWN) {
    Interface::getExtractionType_abi_cxx11_(&this->super_Interface);
    typeName._M_str = (char *)in_stack_fffffffffffffef8.m_it;
    typeName._M_len = (size_t)in_stack_fffffffffffffef0._M_current;
    DVar6 = getTypeFromString(typeName);
    this->targetType = DVar6;
  }
  this->multiUnits = false;
  psVar7 = Interface::getInjectionType_abi_cxx11_(&this->super_Interface);
  psVar8 = Interface::getInjectionUnits_abi_cxx11_(&this->super_Interface);
  typeName_00._M_str = (char *)in_stack_fffffffffffffef8.m_it;
  typeName_00._M_len = (size_t)in_stack_fffffffffffffef0._M_current;
  DVar6 = getTypeFromString(typeName_00);
  this->injectionType = DVar6;
  if (DVar6 != HELICS_MULTI) {
    if (psVar8->_M_string_length == 0) {
      return;
    }
    pcVar1 = (psVar8->_M_dataplus)._M_p;
    if (*pcVar1 != '[') {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + psVar8->_M_string_length);
      uVar11 = ::units::getDefaultFlags();
      _Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               ::units::unit_from_string(&local_70,uVar11);
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      p_Var10->_M_use_count = 1;
      p_Var10->_M_weak_count = 1;
      p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0053fa50;
      p_Var10[1] = _Var16;
      (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)(p_Var10 + 1);
      p_Var13 = (this->inputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var10;
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      peVar3 = (this->inputUnits).
               super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!NAN(peVar3->multiplier_)) {
        return;
      }
      if (peVar3->base_units_ != (unit_data)0xfa94a488) {
        return;
      }
      goto LAB_0026ae58;
    }
  }
  this_00 = &this->sourceTypes;
  local_e0 = psVar8;
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::clear(this_00);
  local_a0 = this;
  if (this->injectionType == HELICS_MULTI) {
    jsonString._M_str = (char *)psVar7->_M_string_length;
    jsonString._M_len = (size_t)&local_d8;
    fileops::loadJsonStr_abi_cxx11_(jsonString);
    local_100.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_100.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_100.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (local_d8.m_type == null) {
      local_100.m_it.primitive_iterator.m_it = 1;
LAB_0026abb9:
      local_120.m_value.object = (object_t *)0x0;
      iVar18._M_current = (pointer)0x0;
      pVar19.m_it = 1;
    }
    else if (local_d8.m_type == array) {
      local_100.m_it.array_iterator._M_current =
           ((local_d8.m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_120.m_value.object = (object_t *)0x0;
      pVar19.m_it = -0x8000000000000000;
      iVar18._M_current =
           ((local_d8.m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (local_d8.m_type != object) {
        local_100.m_it.primitive_iterator.m_it = 0;
        goto LAB_0026abb9;
      }
      local_100.m_it.object_iterator._M_node = (_Base_ptr)(local_d8.m_value.binary)->m_subtype;
      iVar18._M_current = (pointer)0x0;
      pVar19.m_it = -0x8000000000000000;
      local_120.m_value.object =
           (object_t *)&((local_d8.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    local_120._0_8_ = &local_d8;
    local_100.m_object = (pointer)&local_d8;
    while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             (&local_100,
                              (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_120), !bVar5) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*(&local_100);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_c8,pbVar9);
      typeName_01._M_str = (char *)pVar19.m_it;
      typeName_01._M_len = (size_t)iVar18._M_current;
      local_a4 = getTypeFromString(typeName_01);
      local_78 = (void *)0x0;
      std::
      vector<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>,std::allocator<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>>>
      ::emplace_back<helics::DataType,decltype(nullptr)>
                ((vector<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>,std::allocator<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>>>
                  *)this_00,&local_a4,&local_78);
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (((local_100.m_object)->m_data).m_type == array) {
        local_100.m_it.array_iterator._M_current = local_100.m_it.array_iterator._M_current + 1;
      }
      else if (((local_100.m_object)->m_data).m_type == object) {
        local_100.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_100.m_it.object_iterator._M_node);
      }
      else {
        local_100.m_it.primitive_iterator.m_it = local_100.m_it.primitive_iterator.m_it + 1;
      }
    }
    this_02 = &local_d8;
  }
  else {
    jsonString_00._M_str = (char *)local_e0->_M_string_length;
    jsonString_00._M_len = (size_t)&local_120;
    fileops::loadJsonStr_abi_cxx11_(jsonString_00);
    __new_size = local_120._0_8_ & 0xff;
    if (local_120.m_type != null) {
      if (local_120.m_type == object) {
        __new_size = ((local_120.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (local_120.m_type == array) {
        __new_size = (long)((_Rb_tree_node_base *)
                           &(local_120.m_value.array)->
                            super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           )->_M_parent -
                     *(long *)&(local_120.m_value.array)->
                               super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                     >> 4;
      }
      else {
        __new_size = 1;
      }
    }
    local_100.m_object = (pointer)CONCAT44(local_100.m_object._4_4_,this->injectionType);
    local_100.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_100.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    std::
    vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
    ::resize(this_00,__new_size,(value_type *)&local_100);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100.m_it.array_iterator._M_current !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_100.m_it.array_iterator._M_current);
    }
    this_02 = &local_120;
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(this_02);
  pcVar1 = (char *)local_e0->_M_string_length;
  if (pcVar1 == (char *)0x0) {
    return;
  }
  pcVar2 = (local_e0->_M_dataplus)._M_p;
  if (*pcVar2 != '[') {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar1 + (long)pcVar2);
    uVar11 = ::units::getDefaultFlags();
    this = local_a0;
    _Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             ::units::unit_from_string(&local_50,uVar11);
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var10->_M_use_count = 1;
    p_Var10->_M_weak_count = 1;
    p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0053fa50;
    p_Var10[1] = _Var16;
    (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var10 + 1);
    p_Var13 = (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var10;
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    peVar3 = (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((!NAN(peVar3->multiplier_)) || (peVar3->base_units_ != (unit_data)0xfa94a488)) {
      ppVar14 = (this->sourceTypes).
                super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (this->sourceTypes).
               super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar14 == ppVar4) {
        return;
      }
      this_01 = &(ppVar14->second).
                 super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      do {
        ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)(this_01 + -1))->_M_ptr =
             (element_type *)
             (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_01,&(this->inputUnits).
                            super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        ppVar14 = (pointer)(this_01 + 1);
        this_01 = this_01 + 3;
      } while (ppVar14 != ppVar4);
      return;
    }
LAB_0026ae58:
    p_Var13 = (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
    }
    return;
  }
  local_a0->multiUnits = true;
  jsonString_01._M_str = pcVar1;
  jsonString_01._M_len = (size_t)&local_d8;
  fileops::loadJsonStr_abi_cxx11_(jsonString_01);
  local_100.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
  local_100.m_it.array_iterator._M_current = (pointer)0x0;
  local_100.m_it.primitive_iterator.m_it = -0x8000000000000000;
  if (local_d8.m_type == null) {
    local_100.m_it.primitive_iterator.m_it = 1;
  }
  else {
    if (local_d8.m_type == array) {
      local_100.m_it.array_iterator._M_current =
           ((local_d8.m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_120.m_value.object = (object_t *)0x0;
      goto LAB_0026af24;
    }
    if (local_d8.m_type == object) {
      local_100.m_it.object_iterator._M_node = (_Base_ptr)(local_d8.m_value.binary)->m_subtype;
      local_120.m_value.object =
           (object_t *)&((local_d8.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
      goto LAB_0026af24;
    }
    local_100.m_it.primitive_iterator.m_it = 0;
  }
  local_120.m_value.object = (object_t *)0x0;
LAB_0026af24:
  lVar15 = 0x10;
  local_120._0_8_ = &local_d8;
  local_100.m_object = (pointer)&local_d8;
  do {
    bVar5 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_100,
                       (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_120);
    if (bVar5) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_d8);
      return;
    }
    pbVar9 = nlohmann::json_abi_v3_11_3::detail::
             iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             ::operator*(&local_100);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_c8,pbVar9);
    if (local_c0 != 0) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_c8,local_c0 + (long)local_c8);
      uVar11 = ::units::getDefaultFlags();
      pVar17 = ::units::unit_from_string(&local_98,uVar11);
      uVar12 = pVar17._8_8_;
      local_e0 = (string *)pVar17.multiplier_;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      p_Var13->_M_use_count = 1;
      p_Var13->_M_weak_count = 1;
      p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0053fa50;
      p_Var13[1]._vptr__Sp_counted_base = (_func_int **)local_e0;
      p_Var13[1]._M_use_count = (int)uVar12;
      p_Var13[1]._M_weak_count = (int)(uVar12 >> 0x20);
      psVar7 = local_e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        psVar7 = (string *)p_Var13[1]._vptr__Sp_counted_base;
        uVar12 = (ulong)(uint)p_Var13[1]._M_use_count;
      }
      if ((!NAN((double)psVar7)) || (p_Var10 = p_Var13, (int)uVar12 != -0x56b5b78)) {
        ppVar14 = (this_00->
                  super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)ppVar14 + lVar15 + -8) =
             p_Var13 + 1;
        p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&ppVar14->first + lVar15)
        ;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&ppVar14->first + lVar15) = p_Var13
        ;
        if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0026b050;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
LAB_0026b050:
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    if (((local_100.m_object)->m_data).m_type == array) {
      local_100.m_it.array_iterator._M_current = local_100.m_it.array_iterator._M_current + 1;
    }
    else if (((local_100.m_object)->m_data).m_type == object) {
      local_100.m_it.object_iterator._M_node =
           (_Base_ptr)std::_Rb_tree_increment(local_100.m_it.object_iterator._M_node);
    }
    else {
      local_100.m_it.primitive_iterator.m_it = local_100.m_it.primitive_iterator.m_it + 1;
    }
    lVar15 = lVar15 + 0x18;
  } while( true );
}

Assistant:

void Input::loadSourceInformation()
{
    if (targetType == DataType::HELICS_UNKNOWN) {
        targetType = getTypeFromString(getExtractionType());
    }
    multiUnits = false;
    const auto& iType = getInjectionType();
    const auto& iUnits = getInjectionUnits();
    injectionType = getTypeFromString(iType);
    if ((injectionType == DataType::HELICS_MULTI) || (!iUnits.empty() && iUnits.front() == '[')) {
        sourceTypes.clear();
        if (injectionType == DataType::HELICS_MULTI) {
            auto jvalue = fileops::loadJsonStr(iType);
            for (auto& res : jvalue) {
                sourceTypes.emplace_back(getTypeFromString(res.get<std::string>()), nullptr);
            }
        } else {
            auto iValue = fileops::loadJsonStr(iUnits);
            sourceTypes.resize(iValue.size(), {injectionType, nullptr});
        }
        if (!iUnits.empty()) {
            if (iUnits.front() == '[') {
                multiUnits = true;
                auto iValue = fileops::loadJsonStr(iUnits);
                int ii{0};
                for (auto& res : iValue) {
                    auto str = res.get<std::string>();
                    if (!str.empty()) {
                        auto U =
                            std::make_shared<units::precise_unit>(units::unit_from_string(str));
                        if (units::is_valid(*U)) {
                            sourceTypes[ii].second = std::move(U);
                        }
                    }
                    ++ii;
                }
            } else {
                inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
                if (!units::is_valid(*inputUnits)) {
                    inputUnits.reset();
                } else {
                    for (auto& src : sourceTypes) {
                        src.second = inputUnits;
                    }
                }
            }
        }

    } else {
        if (!iUnits.empty()) {
            inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
            if (!units::is_valid(*inputUnits)) {
                inputUnits.reset();
            }
        }
    }
}